

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

void SL::WS_LITE::
     write<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,WSMessage *msg)

{
  ulong uVar1;
  uint5 uVar2;
  byte bVar3;
  anon_union_8_2_7f9ed18d source;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  size_t sVar7;
  error_code ec;
  OpCode local_7a;
  byte local_79;
  ushort uStack_78;
  uint5 uStack_76;
  byte local_71;
  string local_70;
  string *local_50 [2];
  string local_40;
  
  local_71 = 0;
  uStack_78 = 0;
  uStack_76 = 0;
  local_7a = msg->code & 0xf | 0x80;
  uVar1 = msg->len;
  bVar3 = (byte)uVar1;
  if (uVar1 < 0x7e) {
    local_79 = bVar3 | 0x80;
    sVar7 = 2;
  }
  else if (uVar1 < 0x10000) {
    uStack_78 = (ushort)uVar1 << 8 | (ushort)uVar1 >> 8;
    sVar7 = 4;
    local_79 = 0xfe;
  }
  else {
    uStack_78 = (ushort)(byte)(uVar1 >> 0x38) | (ushort)(uVar1 >> 0x28) & 0xff00;
    uVar2 = (uint5)(uVar1 >> 0x18);
    uStack_76 = (uVar2 & 0xff0000) >> 0x10 | uVar2 & 0xff00 | (uint5)(uVar1 >> 8) & 0xff0000 |
                (uint5)(((uVar1 & 0xff0000) << 0x18) >> 0x10) |
                (uint5)(((uVar1 & 0xff00) << 0x28) >> 0x10);
    local_79 = 0xff;
    sVar7 = 10;
    local_71 = bVar3;
    if (0xfffffffe < uVar1) {
      __assert_fail("msg.len < UINT32_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                    ,0x9e,
                    "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                   );
    }
  }
  writeexpire_from_now<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
            (socket,(seconds)(((((socket->
                                 super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->Parent).
                               super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->WriteTimeout).__r);
  local_40.field_2._M_allocated_capacity._0_4_ = 0;
  local_40.field_2._8_8_ = std::_V2::system_category();
  local_70._M_dataplus._M_p = (pointer)&local_7a;
  local_50[0] = &local_70;
  local_70._M_string_length = sVar7;
  sVar4 = asio::detail::
          write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                    (&((socket->
                       super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->Socket,local_50[0],local_50,&local_40.field_2);
  if (local_40.field_2._M_allocated_capacity._0_4_ == 0) {
    if (sVar7 != sVar4) {
      __assert_fail("sendsize == bytes_transferred",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                    ,0xa4,
                    "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                   );
    }
    writeend<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
              (socket,msg,false);
  }
  else {
    (**(code **)(*(long *)local_40.field_2._8_8_ + 0x20))(local_50);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x15e8cc);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != &local_40) {
      operator_delete(local_50[0],(ulong)(local_40._M_dataplus._M_p + 1));
    }
  }
  return;
}

Assistant:

inline void write(const SOCKETTYPE &socket, const SENDBUFFERTYPE &msg)
    {
        size_t sendsize = 0;
        unsigned char header[10] = {};

        setFin(header, 0xFF);
        set_MaskBitForSending(header, isServer);
        setOpCode(header, msg.code);
        setrsv1(header, 0x00);
        setrsv2(header, 0x00);
        setrsv3(header, 0x00);

        if (msg.len <= 125) {
            setpayloadLength1(header, hton(static_cast<unsigned char>(msg.len)));
            sendsize = 2;
        }
        else if (msg.len > USHRT_MAX) {
            setpayloadLength8(header, hton(static_cast<unsigned long long int>(msg.len)));
            setpayloadLength1(header, 127);
            sendsize = 10;
        }
        else {
            setpayloadLength2(header, hton(static_cast<unsigned short>(msg.len)));
            setpayloadLength1(header, 126);
            sendsize = 4;
        }

        assert(msg.len < UINT32_MAX);
        writeexpire_from_now<isServer>(socket, socket->Parent->WriteTimeout);
        std::error_code ec;
        auto bytes_transferred = asio::write(socket->Socket, asio::buffer(header, sendsize), ec);
        UNUSED(bytes_transferred);
        if (!ec) {
            assert(sendsize == bytes_transferred);
            writeend<isServer>(socket, msg, isServer);
        }
        else {
            handleclose(socket, 1002, "write header failed " + ec.message());
        }
    }